

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
TargetFilesystemArtifact<ArtifactPdbTag,_ArtifactPathTag>::Evaluate
          (string *__return_storage_ptr__,
          TargetFilesystemArtifact<ArtifactPdbTag,_ArtifactPathTag> *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagChecker)

{
  bool bVar1;
  __type _Var2;
  TargetType TVar3;
  cmGeneratorTarget *this_00;
  string *this_01;
  GeneratorExpressionContent *content_00;
  string result;
  cmGeneratorTarget *target;
  string name;
  string sStack_b8;
  cmGeneratorTarget *local_98;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  content_00 = content;
  std::__cxx11::string::string
            ((string *)&local_50,
             (string *)
             (parameters->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start);
  bVar1 = cmGeneratorExpression::IsValidTargetName(&local_50);
  if (bVar1) {
    this_00 = cmLocalGenerator::FindGeneratorTargetToUse(context->LG,&local_50);
    local_98 = this_00;
    if (this_00 != (cmGeneratorTarget *)0x0) {
      TVar3 = cmGeneratorTarget::GetType(this_00);
      if (3 < (int)TVar3) {
        TVar3 = cmGeneratorTarget::GetType(this_00);
        if (TVar3 != UNKNOWN_LIBRARY) {
          GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&sStack_b8,content);
          std::operator+(&local_70,"Target \"",&local_50);
          std::operator+(&local_90,&local_70,"\" is not an executable or library.");
          reportError(context,&sStack_b8,&local_90);
          goto LAB_0045b091;
        }
      }
      if (dagChecker != (cmGeneratorExpressionDAGChecker *)0x0) {
        bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                          (dagChecker,local_50._M_dataplus._M_p);
        if (bVar1) {
LAB_0045af93:
          GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&sStack_b8,content);
          std::__cxx11::string::string
                    ((string *)&local_90,
                     "Expressions which require the linker language may not be used while evaluating link libraries"
                     ,(allocator *)&local_70);
          reportError(context,&sStack_b8,&local_90);
          goto LAB_0045aff7;
        }
        bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingSources(dagChecker);
        if (bVar1) {
          cmGeneratorExpressionDAGChecker::TopTarget_abi_cxx11_(&sStack_b8,dagChecker);
          _Var2 = std::operator==(&local_50,&sStack_b8);
          std::__cxx11::string::~string((string *)&sStack_b8);
          if (_Var2) goto LAB_0045af93;
        }
      }
      std::
      _Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
      ::_M_insert_unique<cmGeneratorTarget*const&>
                ((_Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
                  *)&context->DependTargets,&local_98);
      std::
      _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
      ::_M_insert_unique<cmGeneratorTarget_const*const&>
                ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                  *)&context->AllTargets,&local_98);
      TargetFilesystemArtifactResultCreator<ArtifactPdbTag>::Create_abi_cxx11_
                (&sStack_b8,(TargetFilesystemArtifactResultCreator<ArtifactPdbTag> *)local_98,
                 (cmGeneratorTarget *)context,(cmGeneratorExpressionContext *)content,content_00);
      if (context->HadError == true) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      }
      else {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&sStack_b8);
      }
      std::__cxx11::string::~string((string *)&sStack_b8);
      goto LAB_0045b0bd;
    }
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&sStack_b8,content);
    std::operator+(&local_70,"No target \"",&local_50);
    std::operator+(&local_90,&local_70,"\"");
    reportError(context,&sStack_b8,&local_90);
LAB_0045b091:
    std::__cxx11::string::~string((string *)&local_90);
    this_01 = &local_70;
  }
  else {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&sStack_b8,content);
    std::__cxx11::string::string
              ((string *)&local_90,"Expression syntax not recognized.",(allocator *)&local_70);
    reportError(context,&sStack_b8,&local_90);
LAB_0045aff7:
    this_01 = &local_90;
  }
  std::__cxx11::string::~string((string *)this_01);
  std::__cxx11::string::~string((string *)&sStack_b8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_0045b0bd:
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(const std::vector<std::string>& parameters,
                       cmGeneratorExpressionContext* context,
                       const GeneratorExpressionContent* content,
                       cmGeneratorExpressionDAGChecker* dagChecker) const
    CM_OVERRIDE
  {
    // Lookup the referenced target.
    std::string name = *parameters.begin();

    if (!cmGeneratorExpression::IsValidTargetName(name)) {
      ::reportError(context, content->GetOriginalExpression(),
                    "Expression syntax not recognized.");
      return std::string();
    }
    cmGeneratorTarget* target = context->LG->FindGeneratorTargetToUse(name);
    if (!target) {
      ::reportError(context, content->GetOriginalExpression(),
                    "No target \"" + name + "\"");
      return std::string();
    }
    if (target->GetType() >= cmStateEnums::OBJECT_LIBRARY &&
        target->GetType() != cmStateEnums::UNKNOWN_LIBRARY) {
      ::reportError(context, content->GetOriginalExpression(), "Target \"" +
                      name + "\" is not an executable or library.");
      return std::string();
    }
    if (dagChecker && (dagChecker->EvaluatingLinkLibraries(name.c_str()) ||
                       (dagChecker->EvaluatingSources() &&
                        name == dagChecker->TopTarget()))) {
      ::reportError(context, content->GetOriginalExpression(),
                    "Expressions which require the linker language may not "
                    "be used while evaluating link libraries");
      return std::string();
    }
    context->DependTargets.insert(target);
    context->AllTargets.insert(target);

    std::string result =
      TargetFilesystemArtifactResultCreator<ArtifactT>::Create(target, context,
                                                               content);
    if (context->HadError) {
      return std::string();
    }
    return TargetFilesystemArtifactResultGetter<ComponentT>::Get(result);
  }